

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

int __thiscall
cs_impl::any::holder<cs::type_id>::kill(holder<cs::type_id> *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_0025a798 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &allocator + DAT_0025a798;
    DAT_0025a798 = DAT_0025a798 + 1;
    *puVar1 = this;
    return 0x25a590;
  }
  operator_delete(this,0x18);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}